

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

Span<char> __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::GetAppendBufferSlow(CordRepBtree *this,size_t size)

{
  size_type length;
  bool bVar1;
  int iVar2;
  CordRep *this_00;
  CordRepFlat *pCVar3;
  size_t sVar4;
  unsigned_long *puVar5;
  char *pcVar6;
  int local_bc;
  int i_1;
  size_t delta;
  size_t avail;
  CordRep *edge;
  int i;
  CordRepBtree *stack [12];
  CordRepBtree *node;
  size_t sStack_28;
  int depth;
  size_t size_local;
  CordRepBtree *this_local;
  Span<char> span;
  
  sStack_28 = size;
  size_local = (size_t)this;
  iVar2 = height(this);
  if (iVar2 < 4) {
    __assert_fail("height() >= 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x3f7,"Span<char> absl::cord_internal::CordRepBtree::GetAppendBufferSlow(size_t)"
                 );
  }
  bVar1 = RefcountAndFlags::IsOne(&(this->super_CordRep).refcount);
  if (bVar1) {
    iVar2 = height(this);
    edge._4_4_ = 0;
    stack[0xb] = this;
    while( true ) {
      if (iVar2 <= edge._4_4_) {
        avail = (size_t)Edge(stack[0xb],kBack);
        bVar1 = RefcountAndFlags::IsOne(&((CordRep *)avail)->refcount);
        if ((bVar1) && (5 < *(byte *)(avail + 0xc))) {
          pCVar3 = CordRep::flat((CordRep *)avail);
          sVar4 = CordRepFlat::Capacity(pCVar3);
          delta = sVar4 - *(long *)avail;
          if (delta == 0) {
            Span<char>::Span((Span<char> *)&this_local);
          }
          else {
            puVar5 = std::min<unsigned_long>(&stack0xffffffffffffffd8,&delta);
            length = *puVar5;
            pCVar3 = CordRep::flat((CordRep *)avail);
            pcVar6 = CordRepFlat::Data(pCVar3);
            Span<char>::Span((Span<char> *)&this_local,pcVar6 + *(long *)avail,length);
            *(size_type *)avail = length + *(long *)avail;
            (this->super_CordRep).length = length + (this->super_CordRep).length;
            for (local_bc = 0; local_bc < iVar2; local_bc = local_bc + 1) {
              (stack[(long)local_bc + -1]->super_CordRep).length =
                   length + (stack[(long)local_bc + -1]->super_CordRep).length;
            }
          }
        }
        else {
          Span<char>::Span((Span<char> *)&this_local);
        }
        return _this_local;
      }
      this_00 = Edge(stack[0xb],kBack);
      stack[0xb] = CordRep::btree(this_00);
      bVar1 = RefcountAndFlags::IsOne(&(stack[0xb]->super_CordRep).refcount);
      if (!bVar1) break;
      stack[(long)edge._4_4_ + -1] = stack[0xb];
      edge._4_4_ = edge._4_4_ + 1;
    }
    Span<char>::Span((Span<char> *)&this_local);
    return _this_local;
  }
  __assert_fail("refcount.IsOne()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                ,0x3f8,"Span<char> absl::cord_internal::CordRepBtree::GetAppendBufferSlow(size_t)");
}

Assistant:

Span<char> CordRepBtree::GetAppendBufferSlow(size_t size) {
  // The inlined version in `GetAppendBuffer()` deals with all heights <= 3.
  assert(height() >= 4);
  assert(refcount.IsOne());

  // Build a stack of nodes we may potentially need to update if we find a
  // non-shared FLAT with capacity at the leaf level.
  const int depth = height();
  CordRepBtree* node = this;
  CordRepBtree* stack[kMaxDepth];
  for (int i = 0; i < depth; ++i) {
    node = node->Edge(kBack)->btree();
    if (!node->refcount.IsOne()) return {};
    stack[i] = node;
  }

  // Must be a privately owned, mutable flat.
  CordRep* const edge = node->Edge(kBack);
  if (!edge->refcount.IsOne() || edge->tag < FLAT) return {};

  // Must have capacity.
  const size_t avail = edge->flat()->Capacity() - edge->length;
  if (avail == 0) return {};

  // Build span on remaining capacity.
  size_t delta = (std::min)(size, avail);
  Span<char> span = {edge->flat()->Data() + edge->length, delta};
  edge->length += delta;
  this->length += delta;
  for (int i = 0; i < depth; ++i) {
    stack[i]->length += delta;
  }
  return span;
}